

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::structArrayCheck(TParseContext *this,TSourceLoc *param_1,TType *type)

{
  TType *pTVar1;
  uint uVar2;
  int iVar3;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  TType *member;
  int m;
  TTypeList *structure;
  TType *type_local;
  TSourceLoc *param_1_local;
  TParseContext *this_local;
  
  this_00 = &TType::getStruct(type)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  for (member._4_4_ = 0;
      sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_00), member._4_4_ < (int)sVar4; member._4_4_ = member._4_4_ + 1) {
    pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,(long)member._4_4_);
    pTVar1 = pvVar5->type;
    uVar2 = (*pTVar1->_vptr_TType[0x1d])();
    if ((uVar2 & 1) != 0) {
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(long)member._4_4_);
      iVar3 = (*pTVar1->_vptr_TType[0x13])();
      arraySizeRequiredCheck(this,&pvVar5->loc,(TArraySizes *)CONCAT44(extraout_var,iVar3));
    }
  }
  return;
}

Assistant:

void TParseContext::structArrayCheck(const TSourceLoc& /*loc*/, const TType& type)
{
    const TTypeList& structure = *type.getStruct();
    for (int m = 0; m < (int)structure.size(); ++m) {
        const TType& member = *structure[m].type;
        if (member.isArray())
            arraySizeRequiredCheck(structure[m].loc, *member.getArraySizes());
    }
}